

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

_Bool Curl_req_want_send(Curl_easy *data)

{
  uint uVar1;
  _Bool _Var2;
  
  uVar1 = *(uint *)&(data->req).field_0xd9;
  if ((uVar1 & 2) == 0) {
    _Var2 = true;
    if (((data->req).keepon & 0x2aU) != 2) {
      if (((uVar1 >> 0x13 & 1) != 0) && (_Var2 = Curl_bufq_is_empty(&(data->req).sendbuf), !_Var2))
      {
        return true;
      }
      _Var2 = Curl_xfer_needs_flush(data);
      return _Var2;
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool Curl_req_want_send(struct Curl_easy *data)
{
  /* Not done and
   * - KEEP_SEND and not PAUSEd.
   * - or request has buffered data to send
   * - or transfer connection has pending data to send */
  return !data->req.done &&
         (((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) ||
           !Curl_req_sendbuf_empty(data) ||
           Curl_xfer_needs_flush(data));
}